

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::errorEst
          (NavierStokesBase *this,TagBoxArray *tb,int param_3,int param_4,Real param_5,int param_6,
          int param_7)

{
  bool bVar1;
  FabFactory<amrex::FArrayBox> *pFVar2;
  long lVar3;
  AmrLevel *in_RDI;
  MultiFab *S_new;
  EBFArrayBoxFactory *ebfactory;
  MultiFab *in_stack_00000150;
  TagBoxArray *in_stack_00000158;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffc0;
  
  pFVar2 = amrex::AmrLevel::Factory(in_RDI);
  lVar3 = __dynamic_cast(pFVar2,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                         &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (lVar3 != 0) {
    bVar1 = amrex::EBFArrayBoxFactory::isAllRegular((EBFArrayBoxFactory *)0x51ba73);
    if (!bVar1) {
      if (refine_cutcells == 0) {
        amrex::Abort_host(in_stack_ffffffffffffffc0);
      }
      if (refine_cutcells != 0) {
        amrex::AmrLevel::get_new_data(in_RDI,in_stack_ffffffffffffffac);
        amrex::TagCutCells(in_stack_00000158,in_stack_00000150);
      }
    }
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
NavierStokesBase::errorEst (TagBoxArray& tb,
                            int          /*clearval*/,
                            int          /*tagval*/,
                            Real         /*time*/,
                            int          /*n_error_buf*/,
                            int          /*ngrow*/)
{
#ifdef AMREX_USE_EB
    // Enforce that the EB not cross the coarse-fine boundary
    const auto& ebfactory = dynamic_cast<amrex::EBFArrayBoxFactory const&>(Factory());
    if ( !ebfactory.isAllRegular() )
    {
        //
        // FIXME - For now, always refine cut cells
        //   Later, figure out a slick way to check if EB and CFB cross
        //   and allow !refine_cutcells
        //
        if (!refine_cutcells) {
            amrex::Abort("For now, cutcells must always exist at finest level.");
        }

        // Refine on cut cells
        if (refine_cutcells)
        {
            const MultiFab& S_new = get_new_data(State_Type);
            amrex::TagCutCells(tb, S_new);
        }
    }
#else
    amrex::ignore_unused(tb);
#endif
}